

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void encodeUTF8(uint32_t UnicodeScalarValue,SmallVectorImpl<char> *Result)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  char *Elt;
  char local_2a [10];
  
  if (UnicodeScalarValue < 0x80) {
    Elt = local_2a + 9;
  }
  else {
    bVar3 = (byte)UnicodeScalarValue;
    if (UnicodeScalarValue < 0x800) {
      local_2a[8] = (byte)(UnicodeScalarValue >> 6) | 0xc0;
      UnicodeScalarValue = (uint32_t)(bVar3 & 0x3f | 0x80);
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 8);
      Elt = local_2a + 7;
    }
    else if (UnicodeScalarValue < 0x10000) {
      local_2a[6] = (byte)(UnicodeScalarValue >> 0xc) | 0xe0;
      uVar1 = UnicodeScalarValue >> 6;
      UnicodeScalarValue = (uint32_t)(bVar3 & 0x3f | 0x80);
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 6);
      local_2a[5] = (byte)uVar1 & 0x3f | 0x80;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 5);
      Elt = local_2a + 4;
    }
    else {
      if (0x10ffff < UnicodeScalarValue) {
        return;
      }
      local_2a[3] = (byte)(UnicodeScalarValue >> 0x12) | 0xf0;
      uVar1 = UnicodeScalarValue >> 0xc;
      uVar2 = UnicodeScalarValue >> 6;
      UnicodeScalarValue = (uint32_t)(bVar3 & 0x3f | 0x80);
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 3);
      local_2a[2] = (byte)uVar1 & 0x3f | 0x80;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 2);
      local_2a[1] = (byte)uVar2 & 0x3f | 0x80;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&Result->super_SmallVectorTemplateBase<char,_true>,local_2a + 1);
      Elt = local_2a;
    }
  }
  *Elt = (char)UnicodeScalarValue;
  llvm::SmallVectorTemplateBase<char,_true>::push_back
            (&Result->super_SmallVectorTemplateBase<char,_true>,Elt);
  return;
}

Assistant:

static void encodeUTF8( uint32_t UnicodeScalarValue
                      , SmallVectorImpl<char> &Result) {
  if (UnicodeScalarValue <= 0x7F) {
    Result.push_back(UnicodeScalarValue & 0x7F);
  } else if (UnicodeScalarValue <= 0x7FF) {
    uint8_t FirstByte = 0xC0 | ((UnicodeScalarValue & 0x7C0) >> 6);
    uint8_t SecondByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
  } else if (UnicodeScalarValue <= 0xFFFF) {
    uint8_t FirstByte = 0xE0 | ((UnicodeScalarValue & 0xF000) >> 12);
    uint8_t SecondByte = 0x80 | ((UnicodeScalarValue & 0xFC0) >> 6);
    uint8_t ThirdByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
    Result.push_back(ThirdByte);
  } else if (UnicodeScalarValue <= 0x10FFFF) {
    uint8_t FirstByte = 0xF0 | ((UnicodeScalarValue & 0x1F0000) >> 18);
    uint8_t SecondByte = 0x80 | ((UnicodeScalarValue & 0x3F000) >> 12);
    uint8_t ThirdByte = 0x80 | ((UnicodeScalarValue & 0xFC0) >> 6);
    uint8_t FourthByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
    Result.push_back(ThirdByte);
    Result.push_back(FourthByte);
  }
}